

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetDisplayName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this,int32_t index,
          Locale *localeParam)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *src;
  char16_t *pcVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  undefined4 uVar9;
  uint uVar10;
  UnicodeString localeName;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  char16_t *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  if ((index < 0 || this->localizations == (LocalizationInfo *)0x0) ||
     (iVar4 = (*this->localizations->_vptr_LocalizationInfo[3])(), iVar4 <= index)) {
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003e6fd8;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  else {
    src = Locale::getBaseName(localeParam);
    UnicodeString::UnicodeString(&local_70,src,-1,kInvariant);
    uVar9 = local_70.fUnion.fFields.fLength;
    if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
      uVar9 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    pcVar7 = UnicodeString::getBuffer(&local_70,uVar9 + 1);
    do {
      if ((int)uVar9 < 0) {
        iVar4 = (*this->localizations->_vptr_LocalizationInfo[4])
                          (this->localizations,(ulong)(uint)index);
        local_98.p_ = (char16_t *)CONCAT44(extraout_var_00,iVar4);
        UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_98,-1);
        local_80 = local_98.p_;
        break;
      }
      pcVar7[(uint)uVar9] = L'\0';
      uVar5 = (*this->localizations->_vptr_LocalizationInfo[8])(this->localizations,pcVar7);
      if ((int)uVar5 < 0) {
        uVar10 = uVar9;
        if (0 < (int)uVar9) {
          uVar10 = 1;
        }
        uVar6 = uVar10 - 1;
        uVar8 = (ulong)(uint)uVar9;
        do {
          if ((long)uVar8 < 2) goto LAB_0021da8c;
          uVar1 = uVar8 - 1;
          lVar3 = uVar8 - 1;
          uVar8 = uVar1;
        } while (pcVar7[lVar3] != L'_');
        uVar6 = (uint)uVar1;
        uVar10 = uVar6 + 1;
LAB_0021da8c:
        uVar9 = uVar6;
        if (1 < (int)uVar10) {
          uVar10 = 1;
          if ((int)uVar6 < 1) {
            uVar10 = uVar6;
          }
          do {
            uVar9 = uVar6;
            if (pcVar7[(ulong)uVar6 - 1] != L'_') break;
            bVar2 = 1 < (int)uVar6;
            uVar9 = uVar10 - 1;
            uVar6 = uVar6 - 1;
          } while (bVar2);
        }
      }
      else {
        iVar4 = (*this->localizations->_vptr_LocalizationInfo[7])
                          (this->localizations,(ulong)uVar5,(ulong)(uint)index);
        local_a0.p_ = (char16_t *)CONCAT44(extraout_var,iVar4);
        UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_a0,-1);
        local_90 = local_a0.p_;
      }
    } while ((int)uVar5 < 0);
    UnicodeString::~UnicodeString(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString 
RuleBasedNumberFormat::getRuleSetDisplayName(int32_t index, const Locale& localeParam) {
    if (localizations && index >= 0 && index < localizations->getNumberOfRuleSets()) {
        UnicodeString localeName(localeParam.getBaseName(), -1, UnicodeString::kInvariant); 
        int32_t len = localeName.length();
        UChar* localeStr = localeName.getBuffer(len + 1);
        while (len >= 0) {
            localeStr[len] = 0;
            int32_t ix = localizations->indexForLocale(localeStr);
            if (ix >= 0) {
                UnicodeString name(TRUE, localizations->getDisplayName(ix, index), -1);
                return name;
            }
            
            // trim trailing portion, skipping over ommitted sections
            do { --len;} while (len > 0 && localeStr[len] != 0x005f); // underscore
            while (len > 0 && localeStr[len-1] == 0x005F) --len;
        }
        UnicodeString name(TRUE, localizations->getRuleSetName(index), -1);
        return name;
    }
    UnicodeString bogus;
    bogus.setToBogus();
    return bogus;
}